

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O3

Node ** __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::SListIntermediateNode::childByTop
          (SListIntermediateNode *this,Top t,bool canCreate)

{
  bool bVar1;
  Node **res;
  Node **local_10;
  
  bVar1 = Lib::
          SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::SListIntermediateNode::NodePtrComparator>
          ::getPosition<Kernel::TermList::Top>(&this->_nodes,t,&local_10,canCreate);
  if (!bVar1) {
    if (canCreate) {
      *local_10 = (Node *)0x0;
    }
    else {
      local_10 = (Node **)0x0;
    }
  }
  return local_10;
}

Assistant:

virtual Node** childByTop(TermList::Top t, bool canCreate)
      {
        Node** res;
        bool found=_nodes.getPosition(t,res,canCreate);
        if(!found) {
          if(canCreate) {
            *res=0;
          } else {
            res=0;
          }
        }
        return res;
      }